

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_2c92::ndiCOMMHelper(ndicapi *pol,char *command,char *commandReply)

{
  byte bVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  undefined4 local_1c;
  
  local_1c = 0x314e38;
  bVar1 = command[5];
  iVar4 = 0x2580;
  if (((ulong)bVar1 == 0x41 || (bVar1 & 0xf8) == 0x30) && (iVar4 = 0x38400, bVar1 != 0x41)) {
    iVar4 = *(int *)("VER:065EE\r" + (ulong)bVar1 * 4 + 2);
  }
  if (command[6] == '1') {
    local_1c = 0x314e37;
  }
  if (command[7] == '1') {
    uVar3 = 0x4f;
  }
  else {
    if (command[7] != '2') goto LAB_001087da;
    uVar3 = 0x45;
  }
  local_1c._0_2_ = CONCAT11(uVar3,(char)local_1c);
LAB_001087da:
  if (command[8] == '1') {
    local_1c = (uint)CONCAT12(0x32,(undefined2)local_1c);
  }
  cVar2 = command[9];
  ndiSerialSleep(pol->SerialDevice,100);
  iVar4 = ndiSerialComm(pol->SerialDevice,iVar4,(char *)&local_1c,(uint)(cVar2 == '1'));
  if (iVar4 != 0) {
    pol->ErrorCode = 0x102;
    if (pol->ErrorCallback != (_func_void_int_char_ptr_void_ptr *)0x0) {
      (*pol->ErrorCallback)
                (0x102,"Host not capable of given communications parameters",pol->ErrorCallbackData)
      ;
    }
  }
  return;
}

Assistant:

void ndiCOMMHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    static int convert_baud[8] = { 9600, 14400, 19200, 38400, 57600, 115200, 921600, 1228739 };
    char newdps[4] = "8N1";
    int newspeed = 9600;
    int newhand = 0;

    if ((command[5] >= '0' && command[5] <= '7') || command[5] == 'A')
    {
      if (command[5] != 'A')
      {
        newspeed = convert_baud[command[5] - '0'];
      }
      else
      {
        newspeed = 230400;
      }
    }
    if (command[6] == '1')
    {
      newdps[0] = '7';
    }
    if (command[7] == '1')
    {
      newdps[1] = 'O';
    }
    else if (command[7] == '2')
    {
      newdps[1] = 'E';
    }
    if (command[8] == '1')
    {
      newdps[2] = '2';
    }
    if (command[9] == '1')
    {
      newhand = 1;
    }

    ndiSerialSleep(pol->SerialDevice, 100);  // let the device adjust itself
    if (ndiSerialComm(pol->SerialDevice, newspeed, newdps, newhand) != 0)
    {
      ndiSetError(pol, NDI_BAD_COMM);
    }
  }